

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O2

Page * __thiscall sf::Font::loadPage(Font *this,uint characterSize)

{
  iterator iVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_sf::Font::Page>_>,_bool> pVar2;
  uint local_114;
  Page local_110;
  pair<unsigned_int,_sf::Font::Page> local_98;
  
  local_114 = characterSize;
  iVar1 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_sf::Font::Page>,_std::_Select1st<std::pair<const_unsigned_int,_sf::Font::Page>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
          ::find(&(this->m_pages)._M_t,&local_114);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->m_pages)._M_t._M_impl.super__Rb_tree_header) {
    Page::Page(&local_110,this->m_isSmooth);
    local_98.first = local_114;
    Page::Page(&local_98.second,&local_110);
    pVar2 = std::
            _Rb_tree<unsigned_int,std::pair<unsigned_int_const,sf::Font::Page>,std::_Select1st<std::pair<unsigned_int_const,sf::Font::Page>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sf::Font::Page>>>
            ::_M_emplace_unique<std::pair<unsigned_int,sf::Font::Page>>
                      ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,sf::Font::Page>,std::_Select1st<std::pair<unsigned_int_const,sf::Font::Page>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sf::Font::Page>>>
                        *)&this->m_pages,&local_98);
    iVar1._M_node = (_Base_ptr)pVar2.first._M_node;
    Page::~Page(&local_98.second);
    Page::~Page(&local_110);
  }
  return (Page *)&iVar1._M_node[1]._M_parent;
}

Assistant:

Font::Page& Font::loadPage(unsigned int characterSize) const
{
    // TODO: Remove this method and use try_emplace instead when updating to C++17
    PageTable::iterator pageIterator = m_pages.find(characterSize);
    if (pageIterator == m_pages.end())
        pageIterator = m_pages.insert(std::make_pair(characterSize, Page(m_isSmooth))).first;

    return pageIterator->second;
}